

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Packet.cpp
# Opt level: O2

Packet * __thiscall mognetwork::Packet::operator>>(Packet *this,char *data)

{
  pointer pcVar1;
  int iVar2;
  size_t __n;
  int32_t size;
  int local_1c;
  
  local_1c = 0;
  operator>>(this,&local_1c);
  iVar2 = local_1c;
  __n = (size_t)local_1c;
  if (0 < (long)__n) {
    pcVar1 = (this->m_data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(this->m_readerPos + local_1c) <=
        (ulong)((long)(this->m_data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pcVar1)) {
      memcpy(data,pcVar1 + this->m_readerPos,__n);
      data[__n] = '\0';
      this->m_readerPos = this->m_readerPos + iVar2;
    }
  }
  return this;
}

Assistant:

Packet& Packet::operator>>(char* data)
  {
    int32_t size = 0;
    *this >> size;

    if (size > 0 && verifySize(size))
      {
	memcpy(data, &((*m_data)[m_readerPos]), size);
	data[size] = '\0';
	m_readerPos += size;
      }
    return (*this);
  }